

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * tcu::Format::operator<<(ostream *str,Array<void_*const_*> *fmt)

{
  void **ppvVar1;
  
  std::operator<<(str,"{ ");
  for (ppvVar1 = fmt->begin; ppvVar1 != fmt->end; ppvVar1 = ppvVar1 + 1) {
    if (ppvVar1 != fmt->begin) {
      std::operator<<(str,", ");
    }
    std::ostream::_M_insert<void_const*>(str);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}